

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportInstallFileGenerator::GenerateImportCxxModuleConfigTargetInclusion
          (cmExportInstallFileGenerator *this,string *config)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  mapped_type *this_00;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *this_02;
  reference ppcVar4;
  ostream *poVar5;
  cmAlphaNum local_6f0;
  cmAlphaNum local_6c0;
  string local_690;
  char local_669;
  string local_668;
  cmAlphaNum local_648;
  cmAlphaNum local_618;
  undefined1 local_5e8 [8];
  string prop_filename;
  cmGeneratorTarget *tgt;
  iterator __end1;
  iterator __begin1;
  set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
  *__range1;
  mapped_type *prop_files;
  undefined1 local_580 [8];
  ostringstream e;
  string local_408 [8];
  string se;
  cmGeneratedFileStream os;
  cmAlphaNum local_150;
  undefined1 local_120 [8];
  string fileName;
  cmAlphaNum local_f8;
  cmAlphaNum local_c8;
  undefined1 local_98 [8];
  string dest;
  undefined1 local_68 [8];
  string filename_config;
  undefined1 local_40 [8];
  string cxx_modules_dirname;
  string *config_local;
  cmExportInstallFileGenerator *this_local;
  
  cxx_modules_dirname.field_2._8_8_ = config;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x15])(local_40);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)local_68,(string *)cxx_modules_dirname.field_2._8_8_);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_68,"noconfig");
    }
    cmAlphaNum::cmAlphaNum(&local_c8,&(this->super_cmExportFileGenerator).FileDir);
    cmAlphaNum::cmAlphaNum(&local_f8,'/');
    fileName.field_2._M_local_buf[0xf] = '/';
    cmStrCat<std::__cxx11::string,char>
              ((string *)local_98,&local_c8,&local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               fileName.field_2._M_local_buf + 0xf);
    cmAlphaNum::cmAlphaNum(&local_150,(string *)local_98);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&os.field_0x260,"cxx-modules-");
    cmStrCat<std::__cxx11::string,char[7]>
              ((string *)local_120,&local_150,(cmAlphaNum *)&os.field_0x260,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               (char (*) [7])0xdbab91);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)((long)&se.field_2 + 8),(string *)local_120,true,None);
    bVar1 = std::ios::operator!((ios *)((long)&se.field_2 + *(long *)(se.field_2._8_8_ + -0x18) + 8)
                               );
    if ((bVar1 & 1) == 0) {
      cmGeneratedFileStream::SetCopyIfDifferent
                ((cmGeneratedFileStream *)((long)&se.field_2 + 8),true);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this->ConfigCxxModuleFiles,
                             (key_type *)cxx_modules_dirname.field_2._8_8_);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_120);
      this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&this->ConfigCxxModuleTargetFiles,
                             (key_type *)cxx_modules_dirname.field_2._8_8_);
      this_02 = &(this->super_cmExportFileGenerator).ExportedTargets;
      __end1 = std::
               set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
               ::begin(this_02);
      tgt = (cmGeneratorTarget *)
            std::
            set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
            ::end(this_02);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&tgt), bVar2) {
        ppcVar4 = std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator*(&__end1);
        prop_filename.field_2._8_8_ = *ppcVar4;
        cmAlphaNum::cmAlphaNum(&local_618,"target-");
        cmGeneratorTarget::GetExportName_abi_cxx11_
                  (&local_668,(cmGeneratorTarget *)prop_filename.field_2._8_8_);
        cmAlphaNum::cmAlphaNum(&local_648,&local_668);
        local_669 = '-';
        cmStrCat<char,std::__cxx11::string,char[7]>
                  ((string *)local_5e8,&local_618,&local_648,&local_669,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (char (*) [7])0xdbab91);
        std::__cxx11::string::~string((string *)&local_668);
        cmAlphaNum::cmAlphaNum(&local_6c0,(string *)local_98);
        cmAlphaNum::cmAlphaNum(&local_6f0,(string *)local_5e8);
        cmStrCat<>(&local_690,&local_6c0,&local_6f0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this_01,&local_690);
        std::__cxx11::string::~string((string *)&local_690);
        poVar5 = std::operator<<((ostream *)((long)&se.field_2 + 8),
                                 "include(\"${CMAKE_CURRENT_LIST_DIR}/");
        poVar5 = std::operator<<(poVar5,(string *)local_5e8);
        std::operator<<(poVar5,"\")\n");
        std::__cxx11::string::~string((string *)local_5e8);
        std::_Rb_tree_const_iterator<cmGeneratorTarget_*>::operator++(&__end1);
      }
      this_local._7_1_ = true;
      filename_config.field_2._12_4_ = 1;
    }
    else {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_580);
      poVar5 = std::operator<<((ostream *)local_580,"cannot write to file \"");
      poVar5 = std::operator<<(poVar5,(string *)local_120);
      poVar5 = std::operator<<(poVar5,"\": ");
      std::operator<<(poVar5,local_408);
      std::__cxx11::ostringstream::str();
      cmSystemTools::Error((string *)&prop_files);
      std::__cxx11::string::~string((string *)&prop_files);
      this_local._7_1_ = false;
      filename_config.field_2._12_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_580);
      std::__cxx11::string::~string(local_408);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)((long)&se.field_2 + 8));
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    this_local._7_1_ = true;
    filename_config.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_40);
  return this_local._7_1_;
}

Assistant:

bool cmExportInstallFileGenerator::
  GenerateImportCxxModuleConfigTargetInclusion(std::string const& config)
{
  auto cxx_modules_dirname = this->GetCxxModulesDirectory();
  if (cxx_modules_dirname.empty()) {
    return true;
  }

  std::string filename_config = config;
  if (filename_config.empty()) {
    filename_config = "noconfig";
  }

  std::string const dest =
    cmStrCat(this->FileDir, '/', cxx_modules_dirname, '/');
  std::string fileName =
    cmStrCat(dest, "cxx-modules-", filename_config, ".cmake");

  cmGeneratedFileStream os(fileName, true);
  if (!os) {
    std::string se = cmSystemTools::GetLastSystemError();
    std::ostringstream e;
    e << "cannot write to file \"" << fileName << "\": " << se;
    cmSystemTools::Error(e.str());
    return false;
  }
  os.SetCopyIfDifferent(true);

  // Record this per-config import file.
  this->ConfigCxxModuleFiles[config] = fileName;

  auto& prop_files = this->ConfigCxxModuleTargetFiles[config];
  for (auto const* tgt : this->ExportedTargets) {
    auto prop_filename = cmStrCat("target-", tgt->GetExportName(), '-',
                                  filename_config, ".cmake");
    prop_files.emplace_back(cmStrCat(dest, prop_filename));
    os << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << prop_filename << "\")\n";
  }

  return true;
}